

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

void mark_unreachable_bbs(gen_ctx_t gen_ctx)

{
  int iVar1;
  bb_t_conflict pbVar2;
  size_t sVar3;
  out_edge_t local_20;
  edge_t_conflict e;
  bb_t_conflict bb;
  gen_ctx_t gen_ctx_local;
  
  pbVar2 = DLIST_bb_t_el(&gen_ctx->curr_cfg->bbs,2);
  if (pbVar2 != (bb_t_conflict)0x0) {
    if (pbVar2->index != 2) {
      __assert_fail("bb->index == 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                    ,0x1063,"void mark_unreachable_bbs(gen_ctx_t)");
    }
    bitmap_clear(gen_ctx->temp_bitmap);
    VARR_bb_ttrunc(gen_ctx->data_flow_ctx->worklist,0);
    VARR_bb_tpush(gen_ctx->data_flow_ctx->worklist,pbVar2);
    bitmap_set_bit_p(gen_ctx->temp_bitmap,pbVar2->index);
    for (e = (edge_t_conflict)DLIST_bb_t_el(&gen_ctx->curr_cfg->bbs,2); e != (edge_t_conflict)0x0;
        e = (edge_t_conflict)DLIST_bb_t_next((bb_t_conflict)e)) {
      if (*(char *)((long)&e[1].out_link.next + 2) != '\0') {
        VARR_bb_tpush(gen_ctx->data_flow_ctx->worklist,(bb_t_conflict)e);
        bitmap_set_bit_p(gen_ctx->temp_bitmap,(size_t)e->src);
      }
    }
    while (sVar3 = VARR_bb_tlength(gen_ctx->data_flow_ctx->worklist), sVar3 != 0) {
      pbVar2 = VARR_bb_tpop(gen_ctx->data_flow_ctx->worklist);
      for (local_20 = DLIST_out_edge_t_head(&pbVar2->out_edges); local_20 != (out_edge_t)0x0;
          local_20 = DLIST_out_edge_t_next(local_20)) {
        iVar1 = bitmap_set_bit_p(gen_ctx->temp_bitmap,local_20->dst->index);
        if (iVar1 != 0) {
          VARR_bb_tpush(gen_ctx->data_flow_ctx->worklist,local_20->dst);
        }
      }
    }
  }
  return;
}

Assistant:

static void mark_unreachable_bbs (gen_ctx_t gen_ctx) {
  bb_t bb = DLIST_EL (bb_t, curr_cfg->bbs, 2);

  if (bb == NULL) return;
  gen_assert (bb->index == 2);
  bitmap_clear (temp_bitmap);
  VARR_TRUNC (bb_t, worklist, 0);
  VARR_PUSH (bb_t, worklist, bb);
  bitmap_set_bit_p (temp_bitmap, bb->index);
  for (bb = DLIST_EL (bb_t, curr_cfg->bbs, 2); bb != NULL; bb = DLIST_NEXT (bb_t, bb))
    if (bb->reachable_p) {
      VARR_PUSH (bb_t, worklist, bb);
      bitmap_set_bit_p (temp_bitmap, bb->index);
    }
  while (VARR_LENGTH (bb_t, worklist) != 0) {
    bb = VARR_POP (bb_t, worklist);
    for (edge_t e = DLIST_HEAD (out_edge_t, bb->out_edges); e != NULL;
         e = DLIST_NEXT (out_edge_t, e))
      if (bitmap_set_bit_p (temp_bitmap, e->dst->index)) VARR_PUSH (bb_t, worklist, e->dst);
  }
}